

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O1

void gba_system_step(void)

{
  arm7tdmi_t *state;
  gba_apu_t *apu;
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  state = cpu;
  cpu_stepped = false;
  bVar3 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
  cpu->irq = bVar3;
  iVar1 = 1;
  if ((~state->halt & 1U) != 0 || bVar3) {
    cpu_stepped = true;
    iVar1 = arm7tdmi_step(state);
  }
  timer_tick(iVar1);
  bVar3 = SCARRY4(cycles,iVar1);
  cycles = cycles + iVar1;
  if (cycles != 0 && bVar3 == cycles < 0) {
    do {
      apu = ::apu;
      uVar2 = ::apu->apu_cycle_counter + 1;
      ::apu->apu_cycle_counter = uVar2;
      if (0x15d < uVar2) {
        apu->apu_cycle_counter = 0;
        apu_push_sample(apu);
      }
      iVar1 = cycles + -1;
      bVar3 = 1 < cycles;
      cycles = iVar1;
    } while (bVar3);
  }
  return;
}

Assistant:

INLINE int inline_gba_cpu_step() {
    cpu_stepped = false;
    cpu->irq = (bus->interrupt_enable.raw & bus->IF.raw) != 0;
    if (cpu->halt && !cpu->irq) {
        return 1;
    } else {
        cpu_stepped = true;
        return arm7tdmi_step(cpu);
    }
}